

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int calc_verify_data(void *output,ptls_key_schedule_t *sched,void *secret)

{
  ptls_hash_algorithm_t *ppVar1;
  size_t outlen;
  st_ptls_hash_context_t *psVar2;
  int iVar3;
  ptls_hash_context_t *ppVar4;
  ptls_iovec_t secret_00;
  uint8_t digest [64];
  
  ppVar1 = sched->hashes[0].algo;
  outlen = ppVar1->digest_size;
  secret_00.len = outlen;
  secret_00.base = (uint8_t *)secret;
  iVar3 = ptls_hkdf_expand_label
                    (ppVar1,digest,outlen,secret_00,"finished",(ptls_iovec_t)ZEXT816(0),(char *)0x0)
  ;
  if (iVar3 == 0) {
    ppVar1 = sched->hashes[0].algo;
    ppVar4 = ptls_hmac_create(ppVar1,digest,ppVar1->digest_size);
    if (ppVar4 == (ptls_hash_context_t *)0x0) {
      (*ptls_clear_memory)(digest,0x40);
      iVar3 = 0x201;
    }
    else {
      psVar2 = sched->hashes[0].ctx;
      (*psVar2->final)(psVar2,digest,PTLS_HASH_FINAL_MODE_SNAPSHOT);
      (*ppVar4->update)(ppVar4,digest,(sched->hashes[0].algo)->digest_size);
      (*ptls_clear_memory)(digest,0x40);
      iVar3 = 0;
      (*ppVar4->final)(ppVar4,output,PTLS_HASH_FINAL_MODE_FREE);
    }
  }
  return iVar3;
}

Assistant:

static int calc_verify_data(void *output, ptls_key_schedule_t *sched, const void *secret)
{
    ptls_hash_context_t *hmac;
    uint8_t digest[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = ptls_hkdf_expand_label(sched->hashes[0].algo, digest, sched->hashes[0].algo->digest_size,
                                      ptls_iovec_init(secret, sched->hashes[0].algo->digest_size), "finished",
                                      ptls_iovec_init(NULL, 0), NULL)) != 0)
        return ret;
    if ((hmac = ptls_hmac_create(sched->hashes[0].algo, digest, sched->hashes[0].algo->digest_size)) == NULL) {
        ptls_clear_memory(digest, sizeof(digest));
        return PTLS_ERROR_NO_MEMORY;
    }

    sched->hashes[0].ctx->final(sched->hashes[0].ctx, digest, PTLS_HASH_FINAL_MODE_SNAPSHOT);
    PTLS_DEBUGF("%s: %02x%02x,%02x%02x\n", __FUNCTION__, ((uint8_t *)secret)[0], ((uint8_t *)secret)[1], digest[0], digest[1]);
    hmac->update(hmac, digest, sched->hashes[0].algo->digest_size);
    ptls_clear_memory(digest, sizeof(digest));
    hmac->final(hmac, output, PTLS_HASH_FINAL_MODE_FREE);

    return 0;
}